

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O1

uint32_t spvtools::opt::anon_unknown_0::PerformIntegerOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  Type *type;
  undefined4 extraout_var_01;
  uint64_t uVar7;
  uint64_t uVar8;
  Constant *c;
  Instruction *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint32_t val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined4 extraout_var_00;
  
  iVar3 = (*input1->type_->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    __assert_fail("input1->type()->AsInteger()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x259,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  iVar3 = (*input1->type_->_vptr_Type[10])();
  type = (Type *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*type->_vptr_Type[10])(type);
  iVar3 = *(int *)(CONCAT44(extraout_var_01,iVar3) + 0x24);
  if ((iVar3 != 0x20) && (iVar3 != 0x40)) {
    __assert_fail("width == 32 || width == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x25c,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  switch(opcode) {
  case OpIAdd:
    if (iVar3 != 0x40) {
      uVar6 = analysis::Constant::GetU32(input1);
      uVar4 = analysis::Constant::GetU32(input2);
      uVar5 = uVar4 + uVar6;
LAB_00211929:
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar5);
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
LAB_0021196b:
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_48);
        goto LAB_00211978;
      }
      *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar5;
LAB_00211960:
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      goto LAB_00211978;
    }
    uVar7 = analysis::Constant::GetU64(input1);
    uVar8 = analysis::Constant::GetU64(input2);
    uVar7 = uVar7 + uVar8;
    break;
  default:
    __assert_fail("false && \"Unexpected operation\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x27a,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  case OpISub:
    if (iVar3 != 0x40) {
      uVar6 = analysis::Constant::GetU32(input1);
      uVar4 = analysis::Constant::GetU32(input2);
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar6 - uVar4);
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_0021196b;
      *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar6 - uVar4;
      goto LAB_00211960;
    }
    uVar7 = analysis::Constant::GetU64(input1);
    uVar8 = analysis::Constant::GetU64(input2);
    uVar7 = uVar7 - uVar8;
    break;
  case OpIMul:
    if (iVar3 != 0x40) {
      uVar6 = analysis::Constant::GetU32(input1);
      uVar4 = analysis::Constant::GetU32(input2);
      uVar5 = uVar4 * uVar6;
      goto LAB_00211929;
    }
    uVar7 = analysis::Constant::GetU64(input1);
    uVar8 = analysis::Constant::GetU64(input2);
    uVar7 = uVar7 * uVar8;
    break;
  case OpUDiv:
  case OpSDiv:
    __assert_fail("false && \"Should not merge integer division\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x271,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  ExtractInts(&local_48,uVar7);
  puVar2 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar1 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00211978:
  c = analysis::ConstantManager::GetConstant(const_mgr,type,&local_68);
  uVar6 = 0;
  this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0);
  if (this->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(this,(uint)this->has_type_id_);
  }
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return uVar6;
}

Assistant:

uint32_t PerformIntegerOperation(analysis::ConstantManager* const_mgr,
                                 spv::Op opcode,
                                 const analysis::Constant* input1,
                                 const analysis::Constant* input2) {
  assert(input1->type()->AsInteger());
  const analysis::Integer* type = input1->type()->AsInteger();
  uint32_t width = type->AsInteger()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
  // Regardless of the sign of the constant, folding is performed on an unsigned
  // interpretation of the constant data. This avoids signed integer overflow
  // while folding, and works because sign is irrelevant for the IAdd, ISub and
  // IMul instructions.
#define FOLD_OP(op)                                      \
  if (width == 64) {                                     \
    uint64_t val = input1->GetU64() op input2->GetU64(); \
    words = ExtractInts(val);                            \
  } else {                                               \
    uint32_t val = input1->GetU32() op input2->GetU32(); \
    words.push_back(val);                                \
  }                                                      \
  static_assert(true, "require extra semicolon")
  switch (opcode) {
    case spv::Op::OpIMul:
      FOLD_OP(*);
      break;
    case spv::Op::OpSDiv:
    case spv::Op::OpUDiv:
      assert(false && "Should not merge integer division");
      break;
    case spv::Op::OpIAdd:
      FOLD_OP(+);
      break;
    case spv::Op::OpISub:
      FOLD_OP(-);
      break;
    default:
      assert(false && "Unexpected operation");
      break;
  }
#undef FOLD_OP
  const analysis::Constant* merged_const = const_mgr->GetConstant(type, words);
  return const_mgr->GetDefiningInstruction(merged_const)->result_id();
}